

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

QPDFObjGen __thiscall QPDFWriter::getRenumberedObjGen(QPDFWriter *this,QPDFObjGen og)

{
  element_type *peVar1;
  Object *pOVar2;
  QPDFWriter *this_local;
  QPDFObjGen og_local;
  
  peVar1 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  pOVar2 = ObjTable<QPDFWriter::Object>::operator[]
                     (&(peVar1->obj).super_ObjTable<QPDFWriter::Object>,og);
  QPDFObjGen::QPDFObjGen(&og_local,pOVar2->renumber,0);
  return og_local;
}

Assistant:

QPDFObjGen
QPDFWriter::getRenumberedObjGen(QPDFObjGen og)
{
    return QPDFObjGen(m->obj[og].renumber, 0);
}